

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreEvaluators.h
# Opt level: O2

void __thiscall
Eigen::internal::
unary_evaluator<Eigen::Replicate<const_Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,_1,_1>,_Eigen::internal::IndexBased,_float>
::unary_evaluator(unary_evaluator<Eigen::Replicate<const_Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,_1,_1>,_Eigen::internal::IndexBased,_float>
                  *this,XprType *replicate)

{
  PointerType pfVar1;
  undefined8 uVar2;
  XprTypeNested pMVar3;
  long lVar4;
  Index IVar5;
  
  pfVar1 = (replicate->m_matrix).
           super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_Eigen::Dense>.
           super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_true>.
           super_MapBase<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,_0>.
           m_data;
  uVar2 = *(undefined8 *)
           &(replicate->m_matrix).
            super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_Eigen::Dense>.
            super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_true>.
            super_MapBase<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,_0>.
            field_0x8;
  pMVar3 = (replicate->m_matrix).
           super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_Eigen::Dense>.
           super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_true>.m_xpr;
  lVar4 = (replicate->m_matrix).
          super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_true>.
          m_startRow.m_value;
  IVar5 = (replicate->m_matrix).
          super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_true>.
          m_outerStride;
  (this->m_arg).super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_Eigen::Dense>
  .super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_true>.m_startCol.
  m_value = (replicate->m_matrix).
            super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_Eigen::Dense>.
            super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_true>.
            m_startCol.m_value;
  (this->m_arg).super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_Eigen::Dense>
  .super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_true>.m_outerStride
       = IVar5;
  (this->m_arg).super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_Eigen::Dense>
  .super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_true>.m_xpr = pMVar3
  ;
  (this->m_arg).super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_Eigen::Dense>
  .super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_true>.m_startRow.
  m_value = lVar4;
  (this->m_arg).super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_Eigen::Dense>
  .super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,_0>.m_data =
       pfVar1;
  *(undefined8 *)
   &(this->m_arg).
    super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_true>.
    super_MapBase<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,_0>.field_0x8
       = uVar2;
  block_evaluator<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_true>::block_evaluator
            (&(this->m_argImpl).
              super_block_evaluator<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_true>,
             &this->m_arg);
  return;
}

Assistant:

explicit unary_evaluator(const XprType& replicate)
    : m_arg(replicate.nestedExpression()),
      m_argImpl(m_arg),
      m_rows(replicate.nestedExpression().rows()),
      m_cols(replicate.nestedExpression().cols())
  {}